

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UserInterface.cpp
# Opt level: O2

bool __thiscall DialogPrompt::update(DialogPrompt *this,int mouseX,int mouseY,bool clicked)

{
  Transformable *this_00;
  pointer pTVar1;
  pointer pTVar2;
  pointer pCVar3;
  Vector2f *pVVar4;
  uint uVar5;
  uint uVar6;
  TextButton *b;
  pointer pTVar7;
  pointer pTVar8;
  pointer pCVar9;
  
  if ((this->super_UIComponent).super_Transformable.field_0xa9 == '\x01') {
    this_00 = &(this->super_UIComponent).super_Transformable;
    pVVar4 = sf::Transformable::getPosition(this_00);
    uVar6 = mouseX - (int)pVVar4->x;
    pVVar4 = sf::Transformable::getPosition(this_00);
    uVar5 = mouseY - (int)pVVar4->y;
    pTVar1 = (this->optionButtons).super__Vector_base<TextButton,_std::allocator<TextButton>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    for (pTVar7 = (this->optionButtons).super__Vector_base<TextButton,_std::allocator<TextButton>_>.
                  _M_impl.super__Vector_impl_data._M_start; pTVar7 != pTVar1; pTVar7 = pTVar7 + 1) {
      (*(pTVar7->super_UIComponent).super_Drawable._vptr_Drawable[3])
                (pTVar7,(ulong)uVar6,(ulong)uVar5,(ulong)clicked);
    }
    pTVar2 = (this->optionFields).super__Vector_base<TextField,_std::allocator<TextField>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (pTVar8 = (this->optionFields).super__Vector_base<TextField,_std::allocator<TextField>_>.
                  _M_impl.super__Vector_impl_data._M_start; pTVar8 != pTVar2; pTVar8 = pTVar8 + 1) {
      (*(pTVar8->super_UIComponent).super_Drawable._vptr_Drawable[3])
                (pTVar8,(ulong)uVar6,(ulong)uVar5,(ulong)(uint)clicked);
    }
    pCVar3 = (this->optionChecks).super__Vector_base<CheckBox,_std::allocator<CheckBox>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (pCVar9 = (this->optionChecks).super__Vector_base<CheckBox,_std::allocator<CheckBox>_>.
                  _M_impl.super__Vector_impl_data._M_start; pCVar9 != pCVar3; pCVar9 = pCVar9 + 1) {
      (*(pCVar9->super_UIComponent).super_Drawable._vptr_Drawable[3])
                (pCVar9,(ulong)uVar6,(ulong)uVar5,(ulong)(uint)clicked);
    }
  }
  return false;
}

Assistant:

bool DialogPrompt::update(int mouseX, int mouseY, bool clicked) {
    if (visible) {
        mouseX -= static_cast<int>(getPosition().x);
        mouseY -= static_cast<int>(getPosition().y);
        for (TextButton& b : optionButtons) {
            b.update(mouseX, mouseY, clicked);
        }
        for (TextField& f : optionFields) {
            f.update(mouseX, mouseY, clicked);
        }
        for (CheckBox& c : optionChecks) {
            c.update(mouseX, mouseY, clicked);
        }
    }
    return false;
}